

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusLightV::emulate_mthd(MthdCelsiusLightV *this)

{
  uint32_t uVar1;
  long lVar2;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) ==
      0) {
    if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk
        [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] =
             (this->super_SingleMthdTest).super_MthdTest.val,
       *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 2)) {
      for (lVar2 = 0x3a24; lVar2 != 0x3a27; lVar2 = lVar2 + 1) {
        uVar1 = pgraph_celsius_convert_light_v
                          (*(uint32_t *)
                            ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                                   super_RepeatTest.super_Test.rnd._M_x + lVar2 * 4 + 0x2f0U));
        *(uint32_t *)
         ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                super_Test.rnd._M_x + (long)this->which * 0xc + lVar2 * 4 + -8) = uVar1;
      }
    }
    return;
  }
  MthdTest::warn((MthdTest *)this,4);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_junk[idx] = val;
				if (idx == 2) {
					for (int i = 0; i < 3; i++)
						exp.celsius_pipe_light_v[which][i] = pgraph_celsius_convert_light_v(exp.celsius_pipe_junk[i]);
				}
			}
		}
	}